

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf.hpp
# Opt level: O0

clause_size_t bal::Cnf::normalize_clause(uint32_t *literals,clause_size_t literals_size)

{
  bool bVar1;
  int local_20;
  ushort local_1c;
  int i;
  clause_size_t validated_size;
  clause_size_t literals_size_local;
  uint32_t *literals_local;
  
  if (literals_size == 0) {
    __assert_fail("literals_size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                  ,0xf3,
                  "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
                 );
  }
  std::sort<unsigned_int*>(literals,literals + (int)(uint)literals_size);
  bVar1 = false;
  if (1 < *literals) {
    bVar1 = *literals != 0xffffffff;
  }
  if (bVar1) {
    local_1c = 1;
    local_20 = 1;
    while( true ) {
      if ((int)(uint)literals_size <= local_20) {
        return local_1c;
      }
      bVar1 = false;
      if (1 < literals[local_20]) {
        bVar1 = literals[local_20] != 0xffffffff;
      }
      if (!bVar1) break;
      if (literals[local_20] != literals[(int)(local_1c - 1)]) {
        if ((literals[local_20] ^ 1) == literals[(int)(local_1c - 1)]) {
          return 0;
        }
        if ((int)(uint)local_1c < local_20) {
          literals[local_1c] = literals[local_20];
        }
        local_1c = local_1c + 1;
      }
      local_20 = local_20 + 1;
    }
    __assert_fail("literal_t__is_variable(literals[i])",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                  ,0xfa,
                  "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
                 );
  }
  __assert_fail("literal_t__is_variable(literals[0])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/cnf/cnf.hpp"
                ,0xf7,
                "static clause_size_t bal::Cnf::normalize_clause(uint32_t *const, const clause_size_t)"
               );
}

Assistant:

inline static clause_size_t normalize_clause(uint32_t* const literals, const clause_size_t literals_size) {
            assert(literals_size > 0);
            
            std::sort(literals, literals + literals_size);
            
            assert(literal_t__is_variable(literals[0]));
            clause_size_t validated_size = 1;
            for (auto i = 1; i < literals_size; i++) {
                assert(literal_t__is_variable(literals[i]));
                if (literals[i] == literals[validated_size - 1]) {
                    //warning(literals_size, literals, "ignoring duplicate literal");
                    continue;
                } else if ((literals[i] ^ 0x1) == literals[validated_size - 1]) {
                    //warning(literals_size, literals, "ignoring the clause, always satisfied");
                    return 0;
                } else {
                    if (validated_size < i) {
                        literals[validated_size] = literals[i];
                    };
                    validated_size++;
                };
            };
            
            return validated_size;
        }